

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_factory.cpp
# Opt level: O3

shared_ptr<IGraphicsPlugin>
CreateGraphicsPlugin(shared_ptr<Options> *options,shared_ptr<IPlatformPlugin> *platformPlugin)

{
  key_type *__k;
  iterator iVar1;
  invalid_argument *piVar2;
  undefined8 uVar3;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  char unaff_BPL;
  shared_ptr<IGraphicsPlugin> sVar5;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  string local_40;
  
  __k = (key_type *)
        (platformPlugin->super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (__k->_M_string_length == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"No graphics API specified");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>,_IgnoreCaseStringLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>,_IgnoreCaseStringLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>_>
                  *)(anonymous_namespace)::graphicsPluginMap_abi_cxx11_,__k);
  if (iVar1._M_node == (_Base_ptr)((anonymous_namespace)::graphicsPluginMap_abi_cxx11_ + 8)) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    Fmt_abi_cxx11_(&local_40,"Unsupported graphics API \'%s\'",
                   ((platformPlugin->super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->_vptr_IPlatformPlugin);
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_40);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_58 = *(undefined4 *)in_RDX;
  uStack_54 = *(undefined4 *)((long)in_RDX + 4);
  uStack_50 = *(undefined4 *)(in_RDX + 1);
  uStack_4c = *(undefined4 *)((long)in_RDX + 0xc);
  in_RDX[1] = 0;
  *in_RDX = 0;
  if (iVar1._M_node[2]._M_left == (_Base_ptr)0x0) {
    uVar3 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (unaff_BPL != '\0') {
      __cxa_free_exception(options);
    }
    _Unwind_Resume(uVar3);
  }
  (*(code *)iVar1._M_node[2]._M_right)(options,iVar1._M_node + 2,platformPlugin,&local_58);
  _Var4._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_4c,uStack_50) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_4c,uStack_50));
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)options;
  return (shared_ptr<IGraphicsPlugin>)
         sVar5.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IGraphicsPlugin> CreateGraphicsPlugin(const std::shared_ptr<Options>& options,
                                                      std::shared_ptr<IPlatformPlugin> platformPlugin) {
    if (options->GraphicsPlugin.empty()) {
        throw std::invalid_argument("No graphics API specified");
    }

    const auto apiIt = graphicsPluginMap.find(options->GraphicsPlugin);
    if (apiIt == graphicsPluginMap.end()) {
        throw std::invalid_argument(Fmt("Unsupported graphics API '%s'", options->GraphicsPlugin.c_str()));
    }

    return apiIt->second(options, std::move(platformPlugin));
}